

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

optional<pbrt::TriangleIntersection> *
pbrt::IntersectTriangle
          (optional<pbrt::TriangleIntersection> *__return_storage_ptr__,Ray *ray,Float tMax,
          Point3f *p0,Point3f *p1,Point3f *p2)

{
  double dVar1;
  undefined1 auVar2 [16];
  int iVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar26 [56];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar12 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined4 uVar29;
  undefined4 uVar30;
  undefined1 in_ZMM1 [64];
  undefined1 auVar28 [60];
  undefined1 auVar27 [64];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  Vector3<float> VVar43;
  Point3<float> PVar44;
  initializer_list<int> v;
  initializer_list<int> v_00;
  initializer_list<int> v_01;
  initializer_list<int> v_02;
  array<int,_3> p;
  array<int,_3> p_00;
  array<int,_3> p_01;
  array<int,_3> p_02;
  Tuple3<pbrt::Vector3,_float> local_108;
  Tuple3<pbrt::Vector3,_float> local_f8;
  optional<pbrt::TriangleIntersection> *local_e8;
  Tuple3<pbrt::Vector3,_float> local_e0;
  float local_d0;
  float local_cc;
  Tuple3<pbrt::Vector3,_float> local_c8;
  undefined1 local_b8 [8];
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  Tuple3<pbrt::Point3,_float> *local_70;
  uint local_68;
  Tuple3<pbrt::Point3,_float> *local_60;
  uint local_58;
  Tuple3<pbrt::Point3,_float> *local_50;
  uint local_48;
  Tuple3<pbrt::Vector3,_float> *local_40;
  uint local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar28 = in_ZMM1._4_60_;
  auVar26 = in_register_00001204._4_56_;
  iVar3 = (int)p1;
  VVar43 = Point3<float>::operator-(p2,p0);
  local_f8.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar13._8_56_ = auVar26;
  local_f8._0_8_ = vmovlps_avx(auVar13._0_16_);
  VVar43 = Point3<float>::operator-(p1,p0);
  local_e0.z = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar14._8_56_ = auVar26;
  local_e0._0_8_ = vmovlps_avx(auVar14._0_16_);
  VVar43 = Cross<float>((Vector3<float> *)&local_f8,(Vector3<float> *)&local_e0);
  auVar27._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._4_60_ = auVar28;
  auVar15._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar15._8_56_ = auVar26;
  auVar6._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.x *
                 VVar43.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar6._4_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.y *
                 VVar43.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar6._8_4_ = auVar26._0_4_ * auVar26._0_4_;
  auVar6._12_4_ = auVar26._4_4_ * auVar26._4_4_;
  auVar6 = vmovshdup_avx(auVar6);
  auVar6 = vfmadd231ss_fma(auVar6,auVar15._0_16_,auVar15._0_16_);
  auVar6 = vfmadd231ss_fma(auVar6,auVar27._0_16_,auVar27._0_16_);
  if ((auVar6._0_4_ == 0.0) && (!NAN(auVar6._0_4_))) goto LAB_00405908;
  local_e0.z = (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar26 = (undefined1  [56])0x0;
  local_e0.x = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
  local_e0.y = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
  local_e8 = __return_storage_ptr__;
  PVar44 = Point3<float>::operator-(p0,(Vector3<float> *)&local_e0);
  local_f8.z = PVar44.super_Tuple3<pbrt::Point3,_float>.z;
  auVar16._0_8_ = PVar44.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar16._8_56_ = auVar26;
  local_f8._0_8_ = vmovlps_avx(auVar16._0_16_);
  local_c8.z = (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar26 = (undefined1  [56])0x0;
  local_c8.x = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
  local_c8.y = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
  PVar44 = Point3<float>::operator-(p1,(Vector3<float> *)&local_c8);
  local_e0.z = PVar44.super_Tuple3<pbrt::Point3,_float>.z;
  auVar17._0_8_ = PVar44.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar17._8_56_ = auVar26;
  local_e0._0_8_ = vmovlps_avx(auVar17._0_16_);
  local_108.z = (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar26 = (undefined1  [56])0x0;
  fVar8 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
  local_108.x = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
  local_108.y = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
  uVar30 = 0;
  PVar44 = Point3<float>::operator-(p2,(Vector3<float> *)&local_108);
  local_c8.z = PVar44.super_Tuple3<pbrt::Point3,_float>.z;
  auVar18._0_8_ = PVar44.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar18._8_56_ = auVar26;
  local_c8._0_8_ = vmovlps_avx(auVar18._0_16_);
  VVar43 = Abs<pbrt::Vector3,float>(&(ray->d).super_Tuple3<pbrt::Vector3,_float>);
  auVar19._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar19._8_56_ = auVar26;
  auVar7 = vmovshdup_avx(auVar19._0_16_);
  auVar6 = vmaxss_avx(auVar19._0_16_,auVar7);
  auVar26 = ZEXT856(auVar6._8_8_);
  fVar9 = 2.8026e-45;
  if (VVar43.super_Tuple3<pbrt::Vector3,_float>.z < auVar6._0_4_) {
    fVar9 = (float)(uint)(VVar43.super_Tuple3<pbrt::Vector3,_float>.x <= auVar7._0_4_);
  }
  fVar5 = (float)((int)fVar9 + 1);
  if (fVar5 == 4.2039e-45) {
    fVar5 = 0.0;
  }
  fVar4 = (float)((int)fVar5 + 1);
  if (fVar4 == 4.2039e-45) {
    fVar4 = 0.0;
  }
  local_108.y = fVar4;
  local_108.x = fVar5;
  v._M_len = 3;
  v._M_array = (iterator)&local_108;
  local_108.z = fVar9;
  pstd::array<int,_3>::array((array<int,_3> *)&local_40,v);
  uVar29 = 0;
  p.values[1] = 0;
  p.values[0] = local_38;
  p.values[2] = iVar3;
  VVar43 = Permute<pbrt::Vector3,float>((pbrt *)&ray->d,local_40,p);
  auVar20._0_8_ = VVar43.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar20._8_56_ = auVar26;
  local_a8 = auVar20._0_16_;
  local_b8._4_4_ = fVar8;
  local_b8._0_4_ = VVar43.super_Tuple3<pbrt::Vector3,_float>.z;
  uStack_b0 = uVar29;
  uStack_ac = uVar30;
  v_00._M_len = 3;
  v_00._M_array = (iterator)&local_108;
  local_108.z = fVar9;
  pstd::array<int,_3>::array((array<int,_3> *)&local_50,v_00);
  p_00.values[1] = 0;
  p_00.values[0] = local_48;
  p_00.values[2] = iVar3;
  PVar44 = Permute<pbrt::Point3,float>((pbrt *)&local_f8,local_50,p_00);
  local_f8.z = PVar44.super_Tuple3<pbrt::Point3,_float>.z;
  auVar21._0_8_ = PVar44.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar21._8_56_ = auVar26;
  local_f8._0_8_ = vmovlps_avx(auVar21._0_16_);
  v_01._M_len = 3;
  v_01._M_array = (iterator)&local_108;
  local_108.z = fVar9;
  pstd::array<int,_3>::array((array<int,_3> *)&local_60,v_01);
  p_01.values[1] = 0;
  p_01.values[0] = local_58;
  p_01.values[2] = iVar3;
  PVar44 = Permute<pbrt::Point3,float>((pbrt *)&local_e0,local_60,p_01);
  local_e0.z = PVar44.super_Tuple3<pbrt::Point3,_float>.z;
  auVar22._0_8_ = PVar44.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar22._8_56_ = auVar26;
  local_e0._0_8_ = vmovlps_avx(auVar22._0_16_);
  v_02._M_len = 3;
  v_02._M_array = (iterator)&local_108;
  local_108.z = fVar9;
  pstd::array<int,_3>::array((array<int,_3> *)&local_70,v_02);
  p_02.values[1] = 0;
  p_02.values[0] = local_68;
  p_02.values[2] = iVar3;
  PVar44 = Permute<pbrt::Point3,float>((pbrt *)&local_c8,local_70,p_02);
  local_c8.z = PVar44.super_Tuple3<pbrt::Point3,_float>.z;
  auVar23._0_8_ = PVar44.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar23._8_56_ = auVar26;
  auVar31._4_4_ = local_e0.z;
  auVar31._0_4_ = local_e0.z;
  auVar31._8_4_ = local_e0.z;
  auVar31._12_4_ = local_e0.z;
  auVar40._8_8_ = 0;
  auVar40._0_4_ = local_e0.x;
  auVar40._4_4_ = local_e0.y;
  auVar41._4_4_ = local_c8.z;
  auVar41._0_4_ = local_c8.z;
  auVar41._8_4_ = local_c8.z;
  auVar41._12_4_ = local_c8.z;
  auVar7._8_4_ = 0x80000000;
  auVar7._0_8_ = 0x8000000080000000;
  auVar7._12_4_ = 0x80000000;
  auVar6 = vxorps_avx512vl(local_a8,auVar7);
  auVar37._4_4_ = local_b8._0_4_;
  auVar37._0_4_ = local_b8._0_4_;
  auVar37._8_4_ = local_b8._0_4_;
  auVar37._12_4_ = local_b8._0_4_;
  auVar6 = vdivps_avx(auVar6,auVar37);
  auVar36._4_4_ = local_f8.z;
  auVar36._0_4_ = local_f8.z;
  auVar36._8_4_ = local_f8.z;
  auVar36._12_4_ = local_f8.z;
  auVar38._8_8_ = 0;
  auVar38._0_4_ = local_f8.x;
  auVar38._4_4_ = local_f8.y;
  auVar38 = vfmadd231ps_fma(auVar38,auVar6,auVar36);
  auVar40 = vfmadd231ps_fma(auVar40,auVar6,auVar31);
  auVar37 = vfmadd213ps_fma(auVar41,auVar6,auVar23._0_16_);
  auVar6 = vmovshdup_avx(auVar38);
  auVar7 = vmovshdup_avx(auVar40);
  local_f8._0_8_ = vmovlps_avx(auVar38);
  local_e0._0_8_ = vmovlps_avx(auVar40);
  local_c8._0_8_ = vmovlps_avx(auVar37);
  auVar10 = ZEXT416((uint)(auVar6._0_4_ * auVar40._0_4_));
  auVar41 = vfmsub213ss_fma(auVar7,auVar38,auVar10);
  auVar10 = vfnmadd231ss_fma(auVar10,auVar6,auVar40);
  fVar8 = auVar41._0_4_ + auVar10._0_4_;
  local_98 = ZEXT416((uint)fVar8);
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    auVar41 = vmovshdup_avx(auVar37);
    auVar11 = ZEXT416((uint)(auVar7._0_4_ * auVar37._0_4_));
    auVar10 = vfmsub213ss_fma(auVar41,auVar40,auVar11);
    auVar7 = vfnmadd213ss_fma(auVar7,auVar37,auVar11);
    fVar8 = auVar7._0_4_ + auVar10._0_4_;
    local_a8 = ZEXT416((uint)fVar8);
    if ((fVar8 == 0.0) && (!NAN(fVar8))) goto LAB_0040587a;
    auVar7 = ZEXT416((uint)(auVar38._0_4_ * auVar41._0_4_));
    auVar6 = vfmsub213ss_fma(auVar6,auVar37,auVar7);
    auVar7 = vfnmadd213ss_fma(auVar41,auVar38,auVar7);
    fVar8 = auVar6._0_4_ + auVar7._0_4_;
    auVar10 = ZEXT416((uint)fVar8);
    if ((fVar8 == 0.0) && (!NAN(fVar8))) goto LAB_0040587a;
  }
  else {
LAB_0040587a:
    auVar6 = vcvtps2pd_avx(auVar40);
    auVar7 = vcvtps2pd_avx(auVar37);
    auVar37 = vcvtps2pd_avx(auVar38);
    auVar38 = vshufpd_avx(auVar6,auVar6,1);
    auVar42._0_8_ = auVar38._0_8_ * auVar7._0_8_;
    auVar42._8_8_ = auVar38._8_8_ * auVar7._8_8_;
    auVar6 = vshufpd_avx(auVar42,auVar42,1);
    dVar1 = auVar6._0_8_ - auVar42._0_8_;
    auVar6 = vshufpd_avx(auVar37,auVar37,1);
    local_a8._0_4_ = (undefined4)dVar1;
    local_a8._4_4_ = (int)((ulong)dVar1 >> 0x20);
    local_a8._8_8_ = 0;
    auVar11._0_8_ = auVar6._0_8_ * auVar7._0_8_;
    auVar11._8_8_ = auVar6._8_8_ * auVar7._8_8_;
    auVar6 = vhsubpd_avx(auVar11,auVar11);
    auVar10._0_4_ = (float)auVar6._0_8_;
    auVar10._4_12_ = auVar6._4_12_;
    auVar12._0_8_ = auVar38._0_8_ * auVar37._0_8_;
    auVar12._8_8_ = auVar38._8_8_ * auVar37._8_8_;
    auVar6 = vhsubpd_avx(auVar12,auVar12);
    local_98._0_4_ = (undefined4)auVar6._0_8_;
    local_98._4_12_ = auVar6._4_12_;
  }
  fVar5 = local_a8._0_4_;
  fVar9 = auVar10._0_4_;
  fVar8 = local_98._0_4_;
  __return_storage_ptr__ = local_e8;
  if ((((0.0 <= fVar5) && (0.0 <= fVar9)) && (0.0 <= fVar8)) ||
     (((fVar5 <= 0.0 && (fVar9 <= 0.0)) && (fVar8 <= 0.0)))) {
    fVar8 = fVar8 + fVar9 + fVar5;
    if ((fVar8 != 0.0) || (NAN(fVar8))) {
      auVar6 = vinsertps_avx(auVar36,auVar31,0x10);
      fVar5 = 1.0 / (float)local_b8._0_4_;
      local_c8.z = fVar5 * local_c8.z;
      auVar32._0_4_ = fVar5 * auVar6._0_4_;
      auVar32._4_4_ = fVar5 * auVar6._4_4_;
      auVar32._8_4_ = fVar5 * auVar6._8_4_;
      auVar32._12_4_ = fVar5 * auVar6._12_4_;
      auVar6 = vmovshdup_avx(auVar32);
      local_e0.z = auVar6._0_4_;
      auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * local_e0.z)),local_a8,auVar32);
      auVar6 = vfmadd231ss_fma(auVar6,local_98,ZEXT416((uint)local_c8.z));
      local_cc = auVar6._0_4_;
      if (((0.0 <= fVar8) || ((local_cc < 0.0 && (tMax * fVar8 <= local_cc)))) &&
         ((fVar8 <= 0.0 || ((0.0 < local_cc && (local_cc <= tMax * fVar8)))))) {
        local_88 = ZEXT416((uint)(1.0 / fVar8));
        auVar39._8_4_ = 0x7fffffff;
        auVar39._0_8_ = 0x7fffffff7fffffff;
        auVar39._12_4_ = 0x7fffffff;
        auVar6 = vandps_avx(ZEXT416((uint)local_c8.z),auVar39);
        local_cc = local_cc * (1.0 / fVar8);
        auVar7 = vandps_avx(auVar32,auVar39);
        local_108._0_8_ = vmovlps_avx(auVar7);
        local_108.z = auVar6._0_4_;
        local_f8.z = auVar32._0_4_;
        _local_b8 = auVar10;
        fVar8 = MaxComponentValue<pbrt::Vector3,float>(&local_108);
        local_d0 = fVar8 * 1.7881396e-07;
        auVar33._8_4_ = 0x7fffffff;
        auVar33._0_8_ = 0x7fffffff7fffffff;
        auVar33._12_4_ = 0x7fffffff;
        auVar6 = vandps_avx(ZEXT416((uint)local_c8.x),auVar33);
        auVar7 = vinsertps_avx(ZEXT416((uint)local_f8.x),ZEXT416((uint)local_e0.x),0x10);
        auVar7 = vandps_avx(auVar7,auVar33);
        local_108._0_8_ = vmovlps_avx(auVar7);
        local_108.z = auVar6._0_4_;
        fVar9 = MaxComponentValue<pbrt::Vector3,float>(&local_108);
        auVar34._8_4_ = 0x7fffffff;
        auVar34._0_8_ = 0x7fffffff7fffffff;
        auVar34._12_4_ = 0x7fffffff;
        auVar7 = vinsertps_avx(ZEXT416((uint)local_f8.y),ZEXT416((uint)local_e0.y),0x10);
        auVar6 = vandps_avx(ZEXT416((uint)local_c8.y),auVar34);
        auVar7 = vandps_avx(auVar7,auVar34);
        local_108._0_8_ = vmovlps_avx(auVar7);
        local_108.z = auVar6._0_4_;
        auVar24._0_4_ = MaxComponentValue<pbrt::Vector3,float>(&local_108);
        auVar24._4_60_ = extraout_var;
        auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (fVar8 + auVar24._0_4_) * 2.980233e-07)),
                                 auVar24._0_16_,ZEXT416((uint)(fVar9 * 1.192093e-07)));
        auVar37 = vfmadd231ss_fma(auVar6,auVar24._0_16_,
                                  ZEXT416((uint)((fVar8 + fVar9) * 2.980233e-07)));
        auVar7 = vinsertps_avx(local_a8,ZEXT416((uint)local_b8._0_4_),0x1c);
        auVar35._8_4_ = 0x7fffffff;
        auVar35._0_8_ = 0x7fffffff7fffffff;
        auVar35._12_4_ = 0x7fffffff;
        auVar6 = vandps_avx(auVar35,local_98);
        auVar7 = vandps_avx(auVar7,auVar35);
        local_108._0_8_ = vmovlps_avx(auVar7);
        local_108.z = auVar6._0_4_;
        auVar25._0_4_ = MaxComponentValue<pbrt::Vector3,float>(&local_108);
        auVar25._4_60_ = extraout_var_00;
        auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (auVar37._0_4_ + auVar37._0_4_))),
                                 ZEXT416((uint)fVar8),ZEXT416((uint)(auVar25._0_4_ * 1.7881396e-07))
                                );
        auVar6 = vfmadd231ss_fma(auVar6,auVar25._0_16_,ZEXT416((uint)local_d0));
        auVar2._8_4_ = 0x7fffffff;
        auVar2._0_8_ = 0x7fffffff7fffffff;
        auVar2._12_4_ = 0x7fffffff;
        auVar7 = vandps_avx512vl(local_88,auVar2);
        __return_storage_ptr__ = local_e8;
        if (auVar7._0_4_ * auVar6._0_4_ * 3.0 < local_cc) {
          fVar8 = local_88._0_4_;
          local_e8->set = true;
          *(float *)&local_e8->optionalValue = fVar8 * (float)local_a8._0_4_;
          *(float *)((long)&local_e8->optionalValue + 4) = fVar8 * (float)local_b8._0_4_;
          *(float *)((long)&local_e8->optionalValue + 8) = fVar8 * (float)local_98._0_4_;
          *(float *)((long)&local_e8->optionalValue + 0xc) = local_cc;
          return local_e8;
        }
      }
    }
  }
LAB_00405908:
  *(undefined4 *)&__return_storage_ptr__->set = 0;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<TriangleIntersection> IntersectTriangle(const Ray &ray, Float tMax,
                                                       const Point3f &p0,
                                                       const Point3f &p1,
                                                       const Point3f &p2) {
    // Return no intersection if triangle is degenerate
    if (LengthSquared(Cross(p2 - p0, p1 - p0)) == 0)
        return {};

    // Transform triangle vertices to ray coordinate space
    // Translate vertices based on ray origin
    Point3f p0t = p0 - Vector3f(ray.o);
    Point3f p1t = p1 - Vector3f(ray.o);
    Point3f p2t = p2 - Vector3f(ray.o);

    // Permute components of triangle vertices and ray direction
    int kz = MaxComponentIndex(Abs(ray.d));
    int kx = kz + 1;
    if (kx == 3)
        kx = 0;
    int ky = kx + 1;
    if (ky == 3)
        ky = 0;
    Vector3f d = Permute(ray.d, {kx, ky, kz});
    p0t = Permute(p0t, {kx, ky, kz});
    p1t = Permute(p1t, {kx, ky, kz});
    p2t = Permute(p2t, {kx, ky, kz});

    // Apply shear transformation to translated vertex positions
    Float Sx = -d.x / d.z;
    Float Sy = -d.y / d.z;
    Float Sz = 1.f / d.z;
    p0t.x += Sx * p0t.z;
    p0t.y += Sy * p0t.z;
    p1t.x += Sx * p1t.z;
    p1t.y += Sy * p1t.z;
    p2t.x += Sx * p2t.z;
    p2t.y += Sy * p2t.z;

    // Compute edge function coefficients _e0_, _e1_, and _e2_
    Float e0 = DifferenceOfProducts(p1t.x, p2t.y, p1t.y, p2t.x);
    Float e1 = DifferenceOfProducts(p2t.x, p0t.y, p2t.y, p0t.x);
    Float e2 = DifferenceOfProducts(p0t.x, p1t.y, p0t.y, p1t.x);

    // Fall back to double precision test at triangle edges
    if (sizeof(Float) == sizeof(float) && (e0 == 0.0f || e1 == 0.0f || e2 == 0.0f)) {
        double p2txp1ty = (double)p2t.x * (double)p1t.y;
        double p2typ1tx = (double)p2t.y * (double)p1t.x;
        e0 = (float)(p2typ1tx - p2txp1ty);
        double p0txp2ty = (double)p0t.x * (double)p2t.y;
        double p0typ2tx = (double)p0t.y * (double)p2t.x;
        e1 = (float)(p0typ2tx - p0txp2ty);
        double p1txp0ty = (double)p1t.x * (double)p0t.y;
        double p1typ0tx = (double)p1t.y * (double)p0t.x;
        e2 = (float)(p1typ0tx - p1txp0ty);
    }

    // Perform triangle edge and determinant tests
    if ((e0 < 0 || e1 < 0 || e2 < 0) && (e0 > 0 || e1 > 0 || e2 > 0))
        return {};
    Float det = e0 + e1 + e2;
    if (det == 0)
        return {};

    // Compute scaled hit distance to triangle and test against ray $t$ range
    p0t.z *= Sz;
    p1t.z *= Sz;
    p2t.z *= Sz;
    Float tScaled = e0 * p0t.z + e1 * p1t.z + e2 * p2t.z;
    if (det < 0 && (tScaled >= 0 || tScaled < tMax * det))
        return {};
    else if (det > 0 && (tScaled <= 0 || tScaled > tMax * det))
        return {};

    // Compute barycentric coordinates and $t$ value for triangle intersection
    Float invDet = 1 / det;
    Float b0 = e0 * invDet, b1 = e1 * invDet, b2 = e2 * invDet;
    Float t = tScaled * invDet;
    DCHECK(!IsNaN(t));

    // Ensure that computed triangle $t$ is conservatively greater than zero
    // Compute $\delta_z$ term for triangle $t$ error bounds
    Float maxZt = MaxComponentValue(Abs(Vector3f(p0t.z, p1t.z, p2t.z)));
    Float deltaZ = gamma(3) * maxZt;

    // Compute $\delta_x$ and $\delta_y$ terms for triangle $t$ error bounds
    Float maxXt = MaxComponentValue(Abs(Vector3f(p0t.x, p1t.x, p2t.x)));
    Float maxYt = MaxComponentValue(Abs(Vector3f(p0t.y, p1t.y, p2t.y)));
    Float deltaX = gamma(5) * (maxXt + maxZt);
    Float deltaY = gamma(5) * (maxYt + maxZt);

    // Compute $\delta_e$ term for triangle $t$ error bounds
    Float deltaE = 2 * (gamma(2) * maxXt * maxYt + deltaY * maxXt + deltaX * maxYt);

    // Compute $\delta_t$ term for triangle $t$ error bounds and check _t_
    Float maxE = MaxComponentValue(Abs(Vector3f(e0, e1, e2)));
    Float deltaT =
        3 * (gamma(3) * maxE * maxZt + deltaE * maxZt + deltaZ * maxE) * std::abs(invDet);
    if (t <= deltaT)
        return {};

    // Return _TriangleIntersection_ for intersection
    return TriangleIntersection{b0, b1, b2, t};
}